

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,char (*params) [23],unsigned_long *params_1,
          char (*params_2) [4],unsigned_long *params_3)

{
  char (*value) [23];
  kj *pkVar1;
  char (*value_00) [4];
  unsigned_long *value_01;
  unsigned_long *value_02;
  CappedArray<char,_26UL> local_a0;
  ArrayPtr<const_char> local_78;
  CappedArray<char,_26UL> local_68;
  ArrayPtr<const_char> local_40;
  char (*local_30) [4];
  unsigned_long *params_local_3;
  char (*params_local_2) [4];
  unsigned_long *params_local_1;
  char (*params_local) [23];
  
  local_30 = params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [4])params;
  params_local_1 = (unsigned_long *)this;
  params_local = (char (*) [23])__return_storage_ptr__;
  value = ::const((char (*) [23])this);
  local_40 = toCharSequence<char_const(&)[23]>(value);
  pkVar1 = (kj *)fwd<unsigned_long&>((unsigned_long *)params_local_2);
  toCharSequence<unsigned_long&>(&local_68,pkVar1,value_01);
  value_00 = ::const((char (*) [4])params_local_3);
  local_78 = toCharSequence<char_const(&)[4]>(value_00);
  pkVar1 = (kj *)fwd<unsigned_long&>((unsigned_long *)local_30);
  toCharSequence<unsigned_long&>(&local_a0,pkVar1,value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_40,(ArrayPtr<const_char> *)&local_68,
             (CappedArray<char,_26UL> *)&local_78,(ArrayPtr<const_char> *)&local_a0,
             (CappedArray<char,_26UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}